

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

string * __thiscall
leveldb::Histogram::ToString_abi_cxx11_(string *__return_storage_ptr__,Histogram *this)

{
  int b;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  uint local_108;
  char buf [200];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  dVar4 = this->num_;
  local_108 = ~-(uint)(dVar4 == 0.0) & SUB84(this->sum_ / dVar4,0);
  dVar2 = StandardDeviation(this);
  snprintf(buf,200,"Count: %.0f  Average: %.4f  StdDev: %.2f\n",dVar4,local_108,dVar2);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  dVar4 = this->num_;
  dVar2 = this->min_;
  dVar3 = Median(this);
  snprintf(buf,200,"Min: %.4f  Median: %.4f  Max: %.4f\n",~-(ulong)(dVar4 == 0.0) & (ulong)dVar2,
           SUB84(dVar3,0),this->max_);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  dVar4 = 100.0 / this->num_;
  dVar2 = 0.0;
  for (lVar1 = 0; lVar1 != 0x9a; lVar1 = lVar1 + 1) {
    dVar3 = this->buckets_[lVar1];
    uVar5 = 0;
    if (0.0 < dVar3) {
      if (lVar1 != 0) {
        uVar5 = (&DAT_00120048)[lVar1];
      }
      dVar2 = dVar2 + dVar3;
      snprintf(buf,200,"[ %7.0f, %7.0f ) %7.0f %7.3f%% %7.3f%% ",uVar5,(int)(&kBucketLimit)[lVar1],
               dVar3,dVar4 * dVar3,dVar4 * dVar2);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append
                ((ulong)__return_storage_ptr__,
                 (char)(int)((this->buckets_[lVar1] / this->num_) * 20.0 + 0.5));
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Histogram::ToString() const {
  std::string r;
  char buf[200];
  std::snprintf(buf, sizeof(buf), "Count: %.0f  Average: %.4f  StdDev: %.2f\n",
                num_, Average(), StandardDeviation());
  r.append(buf);
  std::snprintf(buf, sizeof(buf), "Min: %.4f  Median: %.4f  Max: %.4f\n",
                (num_ == 0.0 ? 0.0 : min_), Median(), max_);
  r.append(buf);
  r.append("------------------------------------------------------\n");
  const double mult = 100.0 / num_;
  double sum = 0;
  for (int b = 0; b < kNumBuckets; b++) {
    if (buckets_[b] <= 0.0) continue;
    sum += buckets_[b];
    std::snprintf(buf, sizeof(buf), "[ %7.0f, %7.0f ) %7.0f %7.3f%% %7.3f%% ",
                  ((b == 0) ? 0.0 : kBucketLimit[b - 1]),  // left
                  kBucketLimit[b],                         // right
                  buckets_[b],                             // count
                  mult * buckets_[b],                      // percentage
                  mult * sum);  // cumulative percentage
    r.append(buf);

    // Add hash marks based on percentage; 20 marks for 100%.
    int marks = static_cast<int>(20 * (buckets_[b] / num_) + 0.5);
    r.append(marks, '#');
    r.push_back('\n');
  }
  return r;
}